

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool absl::lts_20250127::TryAcquireWithSpinning(atomic<long> *mu)

{
  atomic<long> *paVar1;
  ulong local_88;
  intptr_t v;
  atomic<long> *paStack_78;
  int c;
  atomic<long> *mu_local;
  ulong local_68;
  memory_order local_60;
  int local_5c;
  memory_order __b_1;
  undefined1 local_49;
  ulong local_48;
  undefined4 local_40;
  undefined4 local_3c;
  ulong local_38;
  ulong *local_30;
  atomic<long> *local_28;
  undefined4 local_1c;
  memory_order local_18;
  undefined4 local_14;
  memory_order __b;
  
  ___b = 0xa283c4;
  local_14 = 0;
  paStack_78 = mu;
  local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_1c = (anonymous_namespace)::globals._4_4_;
  v._4_4_ = (anonymous_namespace)::globals._4_4_;
  while( true ) {
    paVar1 = paStack_78;
    ___b_1 = paStack_78;
    local_5c = 0;
    local_60 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_5c - 1U < 2) {
      local_68 = (paVar1->super___atomic_base<long>)._M_i;
    }
    else if (local_5c == 5) {
      local_68 = (paVar1->super___atomic_base<long>)._M_i;
    }
    else {
      local_68 = (paVar1->super___atomic_base<long>)._M_i;
    }
    local_88 = local_68;
    if ((local_68 & 0x11) != 0) break;
    if ((local_68 & 8) == 0) {
      local_48 = local_68 | 8;
      local_28 = paStack_78;
      local_30 = &local_88;
      local_3c = 2;
      local_40 = 0;
      LOCK();
      local_88 = (paStack_78->super___atomic_base<long>)._M_i;
      local_49 = local_68 == local_88;
      if ((bool)local_49) {
        (paStack_78->super___atomic_base<long>)._M_i = local_48;
        local_88 = local_68;
      }
      UNLOCK();
      local_38 = local_48;
      if ((bool)local_49) {
        return true;
      }
    }
    v._4_4_ = v._4_4_ + -1;
    if (v._4_4_ < 1) {
      return false;
    }
  }
  return false;
}

Assistant:

static bool TryAcquireWithSpinning(std::atomic<intptr_t>* mu) {
  int c = globals.spinloop_iterations.load(std::memory_order_relaxed);
  do {  // do/while somewhat faster on AMD
    intptr_t v = mu->load(std::memory_order_relaxed);
    if ((v & (kMuReader | kMuEvent)) != 0) {
      return false;                       // a reader or tracing -> give up
    } else if (((v & kMuWriter) == 0) &&  // no holder -> try to acquire
               mu->compare_exchange_strong(v, kMuWriter | v,
                                           std::memory_order_acquire,
                                           std::memory_order_relaxed)) {
      return true;
    }
  } while (--c > 0);
  return false;
}